

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sysinfo.cc
# Opt level: O1

char * GetenvBeforeMain(char *name)

{
  char *pcVar1;
  byte *pbVar2;
  byte *pbVar3;
  byte bVar4;
  byte bVar5;
  bool bVar6;
  char *pcVar7;
  ulong uVar8;
  long lVar9;
  long *plVar10;
  long lVar11;
  char *pcVar12;
  char *pcVar13;
  long lVar14;
  char *pcVar15;
  char *pcVar16;
  uint uVar17;
  int iVar18;
  
  iVar18 = 0;
  lVar9 = 0;
  do {
    if (lVar9 == -1) goto LAB_0011a39c;
    lVar11 = lVar9 + 1;
    pcVar7 = name + lVar9;
    lVar9 = lVar11;
  } while (*pcVar7 != '\0');
  iVar18 = (int)name + (int)lVar11 + -1;
LAB_0011a39c:
  iVar18 = iVar18 - (int)name;
  pcVar7 = &__environ;
  if (___environ != (long *)0x0) {
    lVar9 = *___environ;
    if (lVar9 == 0) {
      return (char *)0x0;
    }
    lVar11 = (long)iVar18;
    plVar10 = ___environ;
    do {
      lVar14 = 0;
      do {
        if (lVar11 == lVar14) {
          uVar17 = 0;
          break;
        }
        pbVar2 = (byte *)(lVar9 + lVar14);
        pbVar3 = (byte *)(name + lVar14);
        uVar17 = -(uint)(*pbVar2 < *pbVar3) | 1;
        lVar14 = lVar14 + 1;
      } while (*pbVar2 == *pbVar3);
      if ((uVar17 == 0) && (*(char *)(lVar9 + lVar11) == '=')) {
        return (char *)(lVar9 + lVar11 + 1);
      }
      lVar9 = plVar10[1];
      plVar10 = plVar10 + 1;
      if (lVar9 == 0) {
        return (char *)0x0;
      }
    } while( true );
  }
  if (GetenvBeforeMain::envbuf[0] != '\0') goto LAB_0011a4c7;
  uVar8 = syscall(2,"/proc/self/environ",0);
  if ((int)uVar8 == -1) {
    RAW_VLOG(1,
             "Unable to open /proc/self/environ, falling back on getenv(\"%s\"), which may not work"
             ,name);
LAB_0011a4b5:
    pcVar7 = getenv(name);
    bVar6 = false;
  }
  else {
    lVar9 = syscall(0,uVar8 & 0xffffffff,GetenvBeforeMain::envbuf);
    if (lVar9 < 0) {
      RAW_VLOG(1,
               "Unable to open /proc/self/environ, falling back on getenv(\"%s\"), which may not work"
               ,name);
      if ((int)uVar8 != -1) {
        syscall(3,uVar8 & 0xffffffff);
      }
      goto LAB_0011a4b5;
    }
    pcVar7 = (char *)syscall(3,uVar8 & 0xffffffff);
    bVar6 = true;
  }
  if (!bVar6) {
    return pcVar7;
  }
LAB_0011a4c7:
  lVar9 = (long)iVar18;
  pcVar12 = GetenvBeforeMain::envbuf;
  do {
    if (*pcVar12 == '\0') {
      return (char *)0x0;
    }
    pcVar15 = pcVar12 + -0x2d36a0;
    pcVar16 = pcVar12 + -1;
    do {
      if (pcVar15 == (char *)0x0) {
        pcVar13 = (char *)0x0;
        pcVar15 = (char *)0x0;
        break;
      }
      pcVar13 = pcVar16 + 1;
      pcVar15 = pcVar15 + 1;
      pcVar1 = pcVar16 + 1;
      pcVar16 = pcVar13;
    } while (*pcVar1 != '\0');
    if (pcVar13 == (char *)0x0) {
      bVar6 = false;
      pcVar7 = (char *)0x0;
    }
    else {
      lVar11 = 0;
      do {
        if (lVar9 == lVar11) {
          iVar18 = 0;
          break;
        }
        bVar4 = pcVar12[lVar11];
        bVar5 = name[lVar11];
        lVar11 = lVar11 + 1;
        pcVar15 = (char *)((ulong)pcVar15 & 0xffffffff);
        if (bVar4 != bVar5) {
          pcVar15 = (char *)(ulong)(-(uint)(bVar4 < bVar5) | 1);
        }
        iVar18 = (int)pcVar15;
      } while (bVar4 == bVar5);
      if ((iVar18 == 0) && (pcVar12[lVar9] == '=')) {
        pcVar7 = pcVar12 + lVar9 + 1;
        bVar6 = false;
      }
      else {
        pcVar12 = pcVar13 + 1;
        bVar6 = true;
      }
    }
    if (!bVar6) {
      return pcVar7;
    }
  } while( true );
}

Assistant:

const char* GetenvBeforeMain(const char* name) {
  const int namelen = slow_strlen(name);
#if defined(HAVE___ENVIRON)   // if we have it, it's declared in unistd.h
  if (__environ) {            // can exist but be nullptr, if statically linked
    for (char** p = __environ; *p; p++) {
      if (!slow_memcmp(*p, name, namelen) && (*p)[namelen] == '=')
        return *p + namelen+1;
    }
    return nullptr;
  }
#endif
  // static is ok because this function should only be called before
  // main(), when we're single-threaded.
  static char envbuf[16<<10];
  if (*envbuf == '\0') {    // haven't read the environ yet
    int fd = safeopen("/proc/self/environ", O_RDONLY);
    // The -2 below guarantees the last two bytes of the buffer will be \0\0
    if (fd == -1 ||           // unable to open the file, fall back onto libc
        saferead(fd, envbuf, sizeof(envbuf) - 2) < 0) { // error reading file
      RAW_VLOG(1, "Unable to open /proc/self/environ, falling back "
               "on getenv(\"%s\"), which may not work", name);
      if (fd != -1) safeclose(fd);
      return getenv(name);
    }
    safeclose(fd);
  }
  const char* p = envbuf;
  while (*p != '\0') {    // will happen at the \0\0 that terminates the buffer
    // proc file has the format NAME=value\0NAME=value\0NAME=value\0...
    const char* endp = (char*)slow_memchr(p, '\0',
                                          sizeof(envbuf) - (p - envbuf));
    if (endp == nullptr)            // this entry isn't NUL terminated
      return nullptr;
    else if (!slow_memcmp(p, name, namelen) && p[namelen] == '=')    // it's a match
      return p + namelen+1;      // point after =
    p = endp + 1;
  }
  return nullptr;                   // env var never found
}